

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O0

void secp256k1_fe_to_signed62(secp256k1_modinv64_signed62 *r,secp256k1_fe *a)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint64_t a4;
  uint64_t a3;
  uint64_t a2;
  uint64_t a1;
  uint64_t a0;
  uint64_t M62;
  secp256k1_fe *a_local;
  secp256k1_modinv64_signed62 *r_local;
  
  uVar1 = a->n[1];
  uVar2 = a->n[2];
  uVar3 = a->n[3];
  uVar4 = a->n[4];
  r->v[0] = (a->n[0] | uVar1 << 0x34) & 0x3fffffffffffffff;
  r->v[1] = uVar1 >> 10 | (uVar2 & 0xfffff) << 0x2a;
  r->v[2] = uVar2 >> 0x14 | (uVar3 & 0x3fffffff) << 0x20;
  r->v[3] = uVar3 >> 0x1e | (uVar4 & 0xffffffffff) << 0x16;
  r->v[4] = uVar4 >> 0x28;
  return;
}

Assistant:

static void secp256k1_fe_to_signed62(secp256k1_modinv64_signed62 *r, const secp256k1_fe *a) {
    const uint64_t M62 = UINT64_MAX >> 2;
    const uint64_t a0 = a->n[0], a1 = a->n[1], a2 = a->n[2], a3 = a->n[3], a4 = a->n[4];

    r->v[0] = (a0       | a1 << 52) & M62;
    r->v[1] = (a1 >> 10 | a2 << 42) & M62;
    r->v[2] = (a2 >> 20 | a3 << 32) & M62;
    r->v[3] = (a3 >> 30 | a4 << 22) & M62;
    r->v[4] =  a4 >> 40;
}